

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

bool __thiscall IR::DiagHelperCallOpnd::IsEqualInternalSub(DiagHelperCallOpnd *this,Opnd *opnd)

{
  JnHelperMethod JVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (((this->super_HelperCallOpnd).super_Opnd.m_kind != OpndKindHelperCall) ||
     (bVar3 = HelperCallOpnd::IsDiagHelperCallOpnd(&this->super_HelperCallOpnd), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x801,"(m_kind == OpndKindHelperCall && this->IsDiagHelperCallOpnd())",
                       "m_kind == OpndKindHelperCall && this->IsDiagHelperCallOpnd()");
    if (!bVar3) goto LAB_0061c448;
    *puVar4 = 0;
  }
  if ((opnd->m_kind == OpndKindHelperCall) &&
     (bVar3 = HelperCallOpnd::IsDiagHelperCallOpnd((HelperCallOpnd *)opnd), bVar3)) {
    JVar1 = (this->super_HelperCallOpnd).m_fnHelper;
    if (opnd->m_kind != OpndKindHelperCall) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x16a,"(this->IsHelperCallOpnd())","Bad call to AsHelperCallOpnd()");
      if (!bVar3) {
LAB_0061c448:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    if (JVar1 == *(JnHelperMethod *)&opnd[1]._vptr_Opnd) {
      return *(int *)&(this->super_HelperCallOpnd).field_0x14 ==
             *(int *)((long)&opnd[1]._vptr_Opnd + 4);
    }
  }
  return false;
}

Assistant:

bool
DiagHelperCallOpnd::IsEqualInternalSub(Opnd *opnd)
{
    Assert(m_kind == OpndKindHelperCall && this->IsDiagHelperCallOpnd());
    if (!opnd->IsHelperCallOpnd() || !opnd->AsHelperCallOpnd()->IsDiagHelperCallOpnd())
    {
        return false;
    }

    return
        m_fnHelper == opnd->AsHelperCallOpnd()->m_fnHelper &&
        m_argCount == static_cast<DiagHelperCallOpnd*>(opnd)->m_argCount;
}